

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_tree.cc
# Opt level: O1

uint32_t __thiscall IndexTree::allocateNode(IndexTree *this)

{
  uint32_t uVar1;
  
  if (this->current_capacity <= *this->node_count) {
    allocateNode();
  }
  uVar1 = *this->node_count;
  *this->node_count = uVar1 + 1;
  return uVar1;
}

Assistant:

uint32_t IndexTree::allocateNode() {
    if (__glibc_unlikely(*node_count >= current_capacity)) {
//        printf("Re-mapping index file to extend size\n");
        // extend the index file size
        int ret = ftruncate(index_file_fd, index_file_size * 2);
        assert(ret == 0);
        file_map = mremap(file_map, index_file_size, index_file_size * 2, MREMAP_MAYMOVE);
        assert(file_map != MAP_FAILED);
        index_file_size *= 2;
        current_capacity = (uint32_t) (index_file_size - 2 * sizeof(uint32_t)) / sizeof(Node);
        initFileMap();
    }
    *node_count += 1;
    return *node_count - 1;
}